

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O0

bool __thiscall SampleInstance::toggle_playing(SampleInstance *this)

{
  byte bVar1;
  undefined4 uVar2;
  long *in_RDI;
  bool playing;
  
  bVar1 = (**(code **)(*in_RDI + 0x10))();
  if ((bVar1 & 1) == 0) {
    al_set_sample_instance_position(in_RDI[4],(int)in_RDI[6]);
  }
  else {
    uVar2 = al_get_sample_instance_position(in_RDI[4]);
    *(undefined4 *)(in_RDI + 6) = uVar2;
  }
  bVar1 = al_set_sample_instance_playing(in_RDI[4],(bVar1 & 1 ^ 0xff) & 1);
  return (bool)(bVar1 & 1);
}

Assistant:

bool SampleInstance::toggle_playing()
{
   bool playing = is_playing();
   if (playing)
      pos = al_get_sample_instance_position(splinst);
   else
      al_set_sample_instance_position(splinst, pos);
   return al_set_sample_instance_playing(splinst, !playing);
}